

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Heap<int>::Heap(Heap<int> *this,initializer_list<int> list,function<bool_(int_&,_int_&)> *func)

{
  uint uVar1;
  allocator_type local_29;
  
  this->_size = (uint)list._M_len;
  std::vector<int,_std::allocator<int>_>::vector(&this->_data,list,&local_29);
  std::function<bool_(int_&,_int_&)>::function(&this->fun,func);
  if (this->_size != 0) {
    uVar1 = 0;
    do {
      HeapifyDown(this,uVar1);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->_size);
    if (this->_size != 0) {
      uVar1 = 0;
      do {
        HeapifyUp(this,uVar1);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->_size);
    }
  }
  return;
}

Assistant:

Heap<T>::Heap(initializer_list<T> list, function<bool(T &, T &)> func):_size(list.size()),_data(list),fun(func) {
    for(int i=0;i<_size;++i) {
        HeapifyDown(i);

    }
    for(int index=0;index<_size;++index) {
        HeapifyUp(index);
    }

}